

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O0

void nanovdb::io::Internal::read<pbrt::NanoVDBBuffer>
               (istream *is,GridHandle<pbrt::NanoVDBBuffer> *handle,Codec codec)

{
  uint8_t *puVar1;
  long *plVar2;
  NanoVDBBuffer *pNVar3;
  pointer puVar4;
  ulong uVar5;
  runtime_error *prVar6;
  short in_DX;
  GridHandle<pbrt::NanoVDBBuffer> *in_RSI;
  long *in_RDI;
  int status;
  uLongf numBytes;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> tmp;
  fileSize_t size;
  fileSize_t residual;
  char *data;
  uchar *in_stack_ffffffffffffff58;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffff60;
  runtime_error local_68 [20];
  int local_54;
  uint64_t local_50 [4];
  ulong local_30;
  uint64_t local_28;
  uint8_t *local_20;
  short local_12;
  GridHandle<pbrt::NanoVDBBuffer> *local_10;
  long *local_8;
  
  local_12 = in_DX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pNVar3 = GridHandle<pbrt::NanoVDBBuffer>::buffer(in_RSI);
  local_20 = pbrt::NanoVDBBuffer::data(pNVar3);
  pNVar3 = GridHandle<pbrt::NanoVDBBuffer>::buffer(local_10);
  local_28 = pbrt::NanoVDBBuffer::size(pNVar3);
  if (local_12 == 1) {
    std::istream::read((char *)local_8,(long)&local_30);
    operator_new__(local_30);
    std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
    unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    plVar2 = local_8;
    puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (in_stack_ffffffffffffff60);
    std::istream::read((char *)plVar2,(long)puVar4);
    puVar1 = local_20;
    local_50[0] = local_28;
    puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (in_stack_ffffffffffffff60);
    local_54 = uncompress(puVar1,local_50,puVar4,local_30);
    if (local_54 != 0) {
      std::runtime_error::runtime_error(local_68,"Internal read error in ZIP");
      std::runtime_error::~runtime_error(local_68);
    }
    if (local_50[0] != local_28) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"UNZIP failed on byte size");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              (in_stack_ffffffffffffff60);
  }
  else {
    if (local_12 == 2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"BLOSC compression codec was disabled during build");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::read((char *)local_8,(long)local_20);
  }
  uVar5 = std::ios::operator!((ios *)((long)local_8 + *(long *)(*local_8 + -0x18)));
  if ((uVar5 & 1) == 0) {
    return;
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar6,"Failed to read Tree from file");
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Internal::read(std::istream& is, GridHandle<BufferT>& handle, Codec codec)
{
    char*      data = reinterpret_cast<char*>(handle.buffer().data());
    fileSize_t residual = handle.buffer().size();

    // read tree using optional compression
    switch (codec) {
    case Codec::ZIP: {
#ifdef NANOVDB_USE_ZIP
        fileSize_t size;
        is.read(reinterpret_cast<char*>(&size), sizeof(fileSize_t));
        std::unique_ptr<Bytef[]> tmp(new Bytef[size]);
        is.read(reinterpret_cast<char*>(tmp.get()), size);
        uLongf numBytes = residual;
        int    status = uncompress(reinterpret_cast<Bytef*>(data), &numBytes, tmp.get(), static_cast<uLongf>(size));
        if (status != Z_OK)
            std::runtime_error("Internal read error in ZIP");
        if (fileSize_t(numBytes) != residual)
            throw std::runtime_error("UNZIP failed on byte size");
#else
        throw std::runtime_error("ZIP compression codec was disabled during build");
#endif
        break;
    }
    case Codec::BLOSC: {
#ifdef NANOVDB_USE_BLOSC
        do {
            fileSize_t size;
            is.read(reinterpret_cast<char*>(&size), sizeof(fileSize_t));
            std::unique_ptr<char[]> tmp(new char[size]);
            is.read(reinterpret_cast<char*>(tmp.get()), size);
            const fileSize_t chunk = residual < MAX_SIZE ? residual : MAX_SIZE;
            const int        count = blosc_decompress_ctx(tmp.get(), data, size_t(chunk), 1); //fails with more threads :(
            if (count < 1)
                std::runtime_error("Internal read error in BLOSC");
            if (count != int(chunk))
                throw std::runtime_error("BLOSC failed on byte size");
            data += size_t(chunk);
            residual -= chunk;
        } while (residual > 0);
#else
        throw std::runtime_error("BLOSC compression codec was disabled during build");
#endif
        break;
    }
    default:
        is.read(data, residual);
    }
    if (!is) {
        throw std::runtime_error("Failed to read Tree from file");
    }
}